

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLReader::getSpaces(XMLReader *this,XMLBuffer *toFill)

{
  ulong uVar1;
  bool bVar2;
  undefined8 in_RAX;
  XMLSize_t XVar3;
  XMLCh XVar4;
  XMLCh curCh;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  while( true ) {
    while (uVar1 = this->fCharIndex, this->fCharsAvail <= uVar1) {
      bVar2 = refreshCharBuffer(this);
      if (!bVar2) {
        return false;
      }
    }
    XVar4 = this->fCharBuf[uVar1];
    uStack_28 = CONCAT26(XVar4,(undefined6)uStack_28);
    if (-1 < (char)this->fgCharCharsTable[(ushort)XVar4]) break;
    this->fCharIndex = uVar1 + 1;
    if ((XVar4 & 6U) == 0) {
      this->fCurCol = this->fCurCol + 1;
    }
    else {
      handleEOL(this,(XMLCh *)((long)&uStack_28 + 6),false);
      XVar4 = uStack_28._6_2_;
    }
    XVar3 = toFill->fIndex;
    if (XVar3 == toFill->fCapacity) {
      XMLBuffer::ensureCapacity(toFill,1);
      XVar3 = toFill->fIndex;
    }
    toFill->fIndex = XVar3 + 1;
    toFill->fBuffer[XVar3] = XVar4;
  }
  return true;
}

Assistant:

bool XMLReader::getSpaces(XMLBuffer& toFill)
{
    //
    //  We just loop until we either hit a non-space or the end of this
    //  entity. We return true if we returned because of a non-space and
    //  false if because of end of entity.
    //
    //  NOTE:   We have to maintain line/col info here and we have to do
    //          whitespace normalization if we are not already internalized.
    //
    while (true)
    {
        // Loop through the current chars in the buffer
        while (fCharIndex < fCharsAvail)
        {
            // Get the current char out of the buffer
            XMLCh curCh = fCharBuf[fCharIndex];

            //
            //  See if its a white space char. If so, then process it. Else
            //  we've hit a non-space and need to return.
            //
            if (isWhitespace(curCh))
            {
                // Eat this char
                fCharIndex++;

                //
                //  'curCh' is a whitespace(x20|x9|xD|xA), so we only can have
                //  end-of-line combinations with a leading chCR(xD) or chLF(xA)
                //
                //  100000 x20
                //  001001 x9
                //  001010 chLF
                //  001101 chCR
                //  -----------
                //  000110 == (chCR|chLF) & ~(0x9|0x20)
                //
                //  if the result of thelogical-& operation is
                //  true  : 'curCh' must be xA  or xD
                //  false : 'curCh' must be x20 or x9
                //
                if ( ( curCh & (chCR|chLF) & ~(0x9|0x20) ) == 0 )
                {
                    fCurCol++;
                } else
                {
                    handleEOL(curCh, false);
                }

                // Ok we can add this guy to our buffer
                toFill.append(curCh);
            }
             else
            {
                // Return true to indicate we broke out due to a whitespace
                return true;
            }
        }

        //
        //  We've eaten up the current buffer, so lets try to reload it. If
        //  we don't get anything new, then break out. If we do, then we go
        //  back to the top to keep getting spaces.
        //
        if (!refreshCharBuffer())
            break;
    }
    return false;
}